

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::TextureWriterTestHelper<unsigned_char,_3U,_32849U>::resize
          (TextureWriterTestHelper<unsigned_char,_3U,_32849U> *this,createFlags flags,
          ktx_uint32_t layers,ktx_uint32_t faces,ktx_uint32_t dimensions,ktx_uint32_t w,
          ktx_uint32_t h,ktx_uint32_t d)

{
  ktx_uint32_t in_EDX;
  undefined8 in_RDI;
  undefined4 in_R9D;
  ktx_uint32_t in_stack_000000a4;
  ktx_uint32_t in_stack_000000a8;
  ktx_uint32_t in_stack_000000ac;
  ktx_uint32_t in_stack_000000b0;
  createFlags in_stack_000000b4;
  WriterTestHelper<unsigned_char,_3U,_32849U> *in_stack_000000b8;
  ktx_uint32_t in_stack_000000d0;
  ktx_uint32_t in_stack_000000d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_000000e0;
  ktx_uint32_t w_00;
  ktx_uint32_t in_stack_ffffffffffffffd0;
  ktx_uint32_t in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined8 uVar1;
  
  w_00 = 0;
  uVar1 = in_RDI;
  WriterTestHelper<unsigned_char,_3U,_32849U>::resize
            (in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,in_stack_000000ac,
             in_stack_000000a8,in_stack_000000a4,in_stack_000000d0,in_stack_000000d8,
             in_stack_000000e0);
  createInfo::resize((createInfo *)CONCAT44(in_R9D,in_stack_ffffffffffffffe0),
                     (createFlags)((ulong)in_RDI >> 0x20),(ktx_uint32_t)in_RDI,
                     in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,w_00,in_EDX,
                     (ktx_uint32_t)uVar1);
  return;
}

Assistant:

void
    resize(createFlags flags, ktx_uint32_t layers, ktx_uint32_t faces,
           ktx_uint32_t dimensions,
           ktx_uint32_t w, ktx_uint32_t h, ktx_uint32_t d)
    {
        WriterTestHelper<component_type, numComponents, internalformat>::resize(
                                               flags, layers, faces,
                                               dimensions,
                                               w, h, d);
        createInfo.resize(flags, layers, faces,
                          dimensions, w, h, d);
    }